

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O0

int arkode_butcher_order6q
              (sunrealtype *b,sunrealtype **A1,sunrealtype **A2,sunrealtype *c1,sunrealtype **A3,
              sunrealtype *c2,int s)

{
  int iVar1;
  sunrealtype *b_00;
  sunrealtype *z;
  sunrealtype *in_RCX;
  sunrealtype **in_RDX;
  sunrealtype **in_RSI;
  sunrealtype *in_RDI;
  sunrealtype **in_R8;
  sunrealtype *in_R9;
  double dVar2;
  sunrealtype *tmp2;
  sunrealtype *tmp1;
  sunrealtype bAAcAc;
  double local_40;
  sunrealtype *local_38;
  sunrealtype **local_30;
  sunrealtype *local_28;
  sunrealtype **local_20;
  sunrealtype **local_18;
  sunrealtype *local_10;
  uint local_4;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  b_00 = (sunrealtype *)calloc((long)(int)tmp2,8);
  z = (sunrealtype *)calloc((long)(int)tmp2,8);
  iVar1 = arkode_butcher_mv(local_30,local_38,(int)tmp2,b_00);
  if (iVar1 == 0) {
    iVar1 = arkode_butcher_vv(local_28,b_00,(int)tmp2,z);
    if (iVar1 == 0) {
      iVar1 = arkode_butcher_mv(local_20,z,(int)tmp2,b_00);
      if (iVar1 == 0) {
        iVar1 = arkode_butcher_mv(local_18,b_00,(int)tmp2,z);
        if (iVar1 == 0) {
          iVar1 = arkode_butcher_dot(local_10,z,(int)tmp2,&local_40);
          if (iVar1 == 0) {
            free(b_00);
            free(z);
            dVar2 = sqrt(2.220446049250313e-16);
            local_4 = (uint)(ABS(local_40 - 0.004166666666666667) <= dVar2);
          }
          else {
            local_4 = 0;
          }
        }
        else {
          free(b_00);
          free(z);
          local_4 = 0;
        }
      }
      else {
        free(b_00);
        free(z);
        local_4 = 0;
      }
    }
    else {
      free(b_00);
      free(z);
      local_4 = 0;
    }
  }
  else {
    free(b_00);
    free(z);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static sunbooleantype arkode_butcher_order6q(sunrealtype* b, sunrealtype** A1,
                                             sunrealtype** A2, sunrealtype* c1,
                                             sunrealtype** A3, sunrealtype* c2,
                                             int s)
{
  sunrealtype bAAcAc;
  sunrealtype* tmp1 = calloc(s, sizeof(sunrealtype));
  sunrealtype* tmp2 = calloc(s, sizeof(sunrealtype));
  if (arkode_butcher_mv(A3, c2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(c1, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A2, tmp2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A1, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_dot(b, tmp2, s, &bAAcAc)) { return (SUNFALSE); }
  free(tmp1);
  free(tmp2);
  return (SUNRabs(bAAcAc - SUN_RCONST(1.0) / SUN_RCONST(240.0)) > TOL) ? SUNFALSE
                                                                       : SUNTRUE;
}